

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O1

string * ON_UTF_std_wstring_to_std_string
                   (string *__return_storage_ptr__,int bTestByteOrder,wstring *sInputUTF,
                   int sInputUTF_count,uint *error_status,uint error_mask,
                   ON__UINT32 error_code_point,int *end_element_index)

{
  int sInputUTF_count_00;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sInputUTF_count_00 = (int)sInputUTF->_M_string_length;
  if (sInputUTF_count_00 < sInputUTF_count) {
    if (end_element_index != (int *)0x0) {
      *end_element_index = 0;
    }
    if (error_status != (uint *)0x0) {
      *error_status = 1;
    }
  }
  else {
    if (sInputUTF_count != -1) {
      sInputUTF_count_00 = sInputUTF_count;
    }
    ON_UTF_WideChar_to_std_string_abi_cxx11_
              (&local_30,bTestByteOrder,(sInputUTF->_M_dataplus)._M_p,sInputUTF_count_00,
               error_status,error_mask,error_code_point,end_element_index);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ON_UTF_std_wstring_to_std_string(
  int bTestByteOrder,
  const std::wstring& sInputUTF,
  int sInputUTF_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  int* end_element_index
  ) ON_NOEXCEPT
{
  std::string str;
  
  const int sUTF_length = static_cast<int>(sInputUTF.length());

  if ( sInputUTF_count > sUTF_length )
  {
    if ( 0 != end_element_index )
      *end_element_index = 0;
    if ( 0 != error_status )
      *error_status = 1;
    return str;
  }
  
  if ( -1 == sInputUTF_count )
    sInputUTF_count = sUTF_length;

  str = ON_UTF_WideChar_to_std_string(
    bTestByteOrder,
    sInputUTF.c_str(),
    sInputUTF_count,
    error_status,
    error_mask,
    error_code_point,
    end_element_index
    );

  return str;
}